

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_trace.c
# Opt level: O2

void lj_trace_free(global_State *g,GCtrace *T)

{
  size_t *psVar1;
  uint uVar2;
  size_t sVar3;
  
  if (T->traceno != 0) {
    uVar2 = (uint)T->traceno;
    if (uVar2 < *(uint *)&g[1].panic) {
      *(uint *)&g[1].panic = uVar2;
    }
    *(undefined4 *)(g[1].wrapf + (ulong)uVar2 * 4) = 0;
  }
  sVar3 = (ulong)T->nsnap * 0xc + (ulong)(T->nins - T->nk) * 8 + (ulong)T->nsnapmap * 4 + 0x60;
  (g->gc).total = (g->gc).total - (int)sVar3;
  psVar1 = &(g->gc).freed;
  *psVar1 = *psVar1 + sVar3;
  (*g->allocf)(g->allocd,T,sVar3,0);
  psVar1 = &g[5].gc.tabnum;
  *psVar1 = *psVar1 - 1;
  return;
}

Assistant:

void LJ_FASTCALL lj_trace_free(global_State *g, GCtrace *T)
{
  jit_State *J = G2J(g);
  if (T->traceno) {
    lj_gdbjit_deltrace(J, T);
    if (T->traceno < J->freetrace)
      J->freetrace = T->traceno;
    setgcrefnull(J->trace[T->traceno]);
  }
  lj_mem_free(g, T,
    ((sizeof(GCtrace)+7)&~7) + (T->nins-T->nk)*sizeof(IRIns) +
    T->nsnap*sizeof(SnapShot) + T->nsnapmap*sizeof(SnapEntry));
  J->tracenum--;
}